

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O2

void SimpleVFilter16_SSE2(uint8_t *p,int stride,int thresh)

{
  long lVar1;
  longlong *plVar2;
  __m128i q1;
  __m128i q0;
  __m128i p0;
  __m128i p1;
  longlong local_68;
  longlong lStack_60;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  longlong local_38;
  longlong lStack_30;
  
  lVar1 = (long)stride;
  local_38 = *(longlong *)(p + lVar1 * -2);
  lStack_30 = *(longlong *)((long)(p + lVar1 * -2) + 8);
  plVar2 = (longlong *)(p + -lVar1);
  local_48 = *plVar2;
  lStack_40 = plVar2[1];
  local_58 = *(longlong *)p;
  lStack_50 = *(longlong *)(p + 8);
  local_68 = *(longlong *)(p + lVar1);
  lStack_60 = *(longlong *)((long)(p + lVar1) + 8);
  DoFilter2_SSE2((__m128i *)&local_38,(__m128i *)&local_48,(__m128i *)&local_58,(__m128i *)&local_68
                 ,thresh);
  *plVar2 = local_48;
  plVar2[1] = lStack_40;
  *(longlong *)p = local_58;
  *(longlong *)(p + 8) = lStack_50;
  return;
}

Assistant:

static void SimpleVFilter16_SSE2(uint8_t* p, int stride, int thresh) {
  // Load
  __m128i p1 = _mm_loadu_si128((__m128i*)&p[-2 * stride]);
  __m128i p0 = _mm_loadu_si128((__m128i*)&p[-stride]);
  __m128i q0 = _mm_loadu_si128((__m128i*)&p[0]);
  __m128i q1 = _mm_loadu_si128((__m128i*)&p[stride]);

  DoFilter2_SSE2(&p1, &p0, &q0, &q1, thresh);

  // Store
  _mm_storeu_si128((__m128i*)&p[-stride], p0);
  _mm_storeu_si128((__m128i*)&p[0], q0);
}